

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

int32 __thiscall
Js::JavascriptArray::HeadSegmentIndexOfHelper
          (JavascriptArray *this,Var search,uint32 *fromIndex,uint32 toIndex,bool includesAlgorithm,
          ScriptContext *scriptContext)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  TypeId TVar4;
  BOOL BVar5;
  undefined4 *puVar6;
  SparseArraySegmentBase *pSVar7;
  uint local_70;
  Type local_68;
  uint32 *local_58;
  Var element;
  uint32 i;
  uint32 toIndexTrimmed;
  SparseArraySegment<void_*> *head;
  ScriptContext *pSStack_38;
  bool isSearchTaggedInt;
  ScriptContext *scriptContext_local;
  bool includesAlgorithm_local;
  uint32 *puStack_28;
  uint32 toIndex_local;
  uint32 *fromIndex_local;
  Var search_local;
  JavascriptArray *this_local;
  
  pSStack_38 = scriptContext;
  scriptContext_local._3_1_ = includesAlgorithm;
  scriptContext_local._4_4_ = toIndex;
  puStack_28 = fromIndex;
  fromIndex_local = (uint32 *)search;
  search_local = this;
  TVar4 = RecyclableObject::GetTypeId((RecyclableObject *)this);
  bVar3 = IsNonES5Array(TVar4);
  if (bVar3) {
    TVar4 = RecyclableObject::GetTypeId((RecyclableObject *)this);
    bVar3 = JavascriptNativeArray::Is(TVar4);
    if (!bVar3) goto LAB_010cd2d2;
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar6 = 1;
  bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                              ,0x10a7,
                              "(IsNonES5Array(GetTypeId()) && !JavascriptNativeArray::Is(GetTypeId()))"
                              ,
                              "IsNonES5Array(GetTypeId()) && !JavascriptNativeArray::Is(GetTypeId())"
                             );
  if (!bVar3) {
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  }
  puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar6 = 0;
LAB_010cd2d2:
  bVar3 = HasNoMissingValues(this);
  if ((bVar3) && (uVar1 = *puStack_28, pSVar7 = GetHead(this), uVar1 < pSVar7->length)) {
    head._7_1_ = TaggedInt::Is(fromIndex_local);
    _i = GetHead(this);
    if (_i->length < scriptContext_local._4_4_) {
      local_68 = _i->length;
    }
    else {
      local_68 = scriptContext_local._4_4_;
    }
    element._4_4_ = local_68;
    for (element._0_4_ = *puStack_28; uVar1 = scriptContext_local._4_4_,
        (uint)element < element._4_4_; element._0_4_ = (uint)element + 1) {
      local_58 = (uint32 *)
                 SparseArraySegment<void_*>::GetElement
                           ((SparseArraySegment<void_*> *)_i,(uint)element);
      if (((head._7_1_ & 1) == 0) || (bVar3 = TaggedInt::Is(local_58), !bVar3)) {
        bVar3 = SparseArraySegment<void_*>::IsMissingItem(&local_58);
        if (bVar3) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                      ,0x10c0,"(false)","false");
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 0;
        }
        else {
          if (((scriptContext_local._3_1_ & 1) != 0) &&
             (bVar3 = JavascriptConversion::SameValueZero(local_58,fromIndex_local), bVar3)) {
            return (uint)element;
          }
          BVar5 = Js::JavascriptOperators::StrictEqual(local_58,fromIndex_local,pSStack_38);
          if (BVar5 != 0) {
            return (uint)element;
          }
        }
      }
      else if (fromIndex_local == local_58) {
        return (uint)element;
      }
    }
    pSVar7 = GetHead(this);
    if (pSVar7->length < uVar1) {
      pSVar7 = GetHead(this);
      local_70 = pSVar7->length;
    }
    else {
      local_70 = 0xffffffff;
    }
    *puStack_28 = local_70;
  }
  return -1;
}

Assistant:

int32 JavascriptArray::HeadSegmentIndexOfHelper(Var search, uint32 &fromIndex, uint32 toIndex, bool includesAlgorithm, ScriptContext * scriptContext)
    {
        Assert(IsNonES5Array(GetTypeId()) && !JavascriptNativeArray::Is(GetTypeId()));

        if (!HasNoMissingValues() || fromIndex >= GetHead()->length)
        {
            return -1;
        }

        bool isSearchTaggedInt = TaggedInt::Is(search);
        // We need to cast head segment to SparseArraySegment<Var> to have access to GetElement (onSparseArraySegment<T>). Because there are separate overloads of this
        // virtual method on JavascriptNativeIntArray and JavascriptNativeFloatArray, we know this version of this method will only be called for true JavascriptArray, and not for
        // either of the derived native arrays, so the elements of each segment used here must be Vars. Hence, the cast is safe.
        SparseArraySegment<Var>* head = static_cast<SparseArraySegment<Var>*>(GetHead());
        uint32 toIndexTrimmed = toIndex <= head->length ? toIndex : head->length;
        for (uint32 i = fromIndex; i < toIndexTrimmed; i++)
        {
            Var element = head->GetElement(i);
            if (isSearchTaggedInt && TaggedInt::Is(element))
            {
                if (search == element)
                {
                    return i;
                }
            }
            else if (SparseArraySegment<Var>::IsMissingItem(&element))
            {
                AssertOrFailFast(false);
            }
            else if (includesAlgorithm && JavascriptConversion::SameValueZero(element, search))
            {
                //Array.prototype.includes
                return i;
            }
            else if (JavascriptOperators::StrictEqual(element, search, scriptContext))
            {
                //Array.prototype.indexOf
                return i;
            }
        }

        // Element not found in the head segment. Keep looking only if the range of indices extends past
        // the head segment.
        fromIndex = toIndex > GetHead()->length ? GetHead()->length : -1;
        return -1;
    }